

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::EncodeAPIParameterized_HighBDEncoderHighBDFrames_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::EncodeAPIParameterized_HighBDEncoderHighBDFrames_Test>
             *this)

{
  TestWithParam<std::tuple<unsigned_int,_int,_unsigned_int>_> *this_00;
  
  WithParamInterface<std::tuple<unsigned_int,int,unsigned_int>>::parameter_ = &this->parameter_;
  this_00 = (TestWithParam<std::tuple<unsigned_int,_int,_unsigned_int>_> *)operator_new(0x18);
  TestWithParam<std::tuple<unsigned_int,_int,_unsigned_int>_>::TestWithParam(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__TestWithParam_00f2c140;
  (this_00->super_WithParamInterface<std::tuple<unsigned_int,_int,_unsigned_int>_>).
  _vptr_WithParamInterface =
       (_func_int **)&PTR__EncodeAPIParameterized_HighBDEncoderHighBDFrames_Test_00f2c180;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }